

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

CURLcode cw_out_append(cw_out_ctx *ctx,cw_out_type otype,char *buf,size_t blen)

{
  size_t sVar1;
  cw_out_buf *pcVar2;
  cw_out_buf *cwbuf;
  size_t blen_local;
  char *buf_local;
  cw_out_type otype_local;
  cw_out_ctx *ctx_local;
  
  sVar1 = cw_out_bufs_len(ctx);
  if (sVar1 + blen < 0x4000001) {
    if (((ctx->buf == (cw_out_buf *)0x0) || (ctx->buf->type != otype)) || (otype == CW_OUT_HDS)) {
      pcVar2 = cw_out_buf_create(otype);
      if (pcVar2 == (cw_out_buf *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar2->next = ctx->buf;
      ctx->buf = pcVar2;
    }
    ctx_local._4_4_ = Curl_dyn_addn(&ctx->buf->b,buf,blen);
  }
  else {
    ctx_local._4_4_ = CURLE_TOO_LARGE;
  }
  return ctx_local._4_4_;
}

Assistant:

static CURLcode cw_out_append(struct cw_out_ctx *ctx,
                              cw_out_type otype,
                              const char *buf, size_t blen)
{
  if(cw_out_bufs_len(ctx) + blen > DYN_PAUSE_BUFFER)
    return CURLE_TOO_LARGE;

  /* if we do not have a buffer, or it is of another type, make a new one.
   * And for CW_OUT_HDS always make a new one, so we "replay" headers
   * exactly as they came in */
  if(!ctx->buf || (ctx->buf->type != otype) || (otype == CW_OUT_HDS)) {
    struct cw_out_buf *cwbuf = cw_out_buf_create(otype);
    if(!cwbuf)
      return CURLE_OUT_OF_MEMORY;
    cwbuf->next = ctx->buf;
    ctx->buf = cwbuf;
  }
  DEBUGASSERT(ctx->buf && (ctx->buf->type == otype));
  return Curl_dyn_addn(&ctx->buf->b, buf, blen);
}